

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall helics::apps::Player::generatePublications(Player *this)

{
  _Hash_node_base _Var1;
  _Hash_node_base *p_Var2;
  DataType type;
  iterator iVar3;
  char *extraout_RDX;
  __node_base *p_Var4;
  string_view typeName;
  string_view name;
  key_type local_40;
  
  p_Var4 = &(this->tags)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    local_40._M_str = *(char **)(p_Var4 + 1);
    local_40._M_len = *(size_t *)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
    iVar3 = CLI::std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->pubids)._M_h,&local_40);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      _Var1._M_nxt = p_Var4[1]._M_nxt;
      p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
      typeName._M_str = extraout_RDX;
      typeName._M_len = (size_t)p_Var4[5]._M_nxt;
      type = getTypeFromString((helics *)p_Var4[6]._M_nxt,typeName);
      name._M_str = (char *)_Var1._M_nxt;
      name._M_len = (size_t)p_Var2;
      addPublication(this,name,type,(string_view)ZEXT816(0));
    }
  }
  return;
}

Assistant:

void Player::generatePublications()
{
    for (auto& tname : tags) {
        if (pubids.find(tname.first) == pubids.end()) {
            addPublication(tname.first, helics::getTypeFromString(tname.second));
        }
    }
}